

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_array_splitting.cpp
# Opt level: O2

ir_visitor_status __thiscall
anon_unknown.dwarf_87480::ir_array_reference_visitor::visit
          (ir_array_reference_visitor *this,ir_dereference_variable *ir)

{
  variable_entry *pvVar1;
  
  pvVar1 = get_variable_entry(this,ir->var);
  if ((this->super_ir_hierarchical_visitor).in_assignee == true) {
    if (pvVar1 == (variable_entry *)0x0) {
      return visit_continue;
    }
    if (this->in_whole_array_copy != false) {
      return visit_continue;
    }
  }
  else if (pvVar1 == (variable_entry *)0x0) {
    return visit_continue;
  }
  pvVar1->split = false;
  return visit_continue;
}

Assistant:

ir_visitor_status
ir_array_reference_visitor::visit(ir_dereference_variable *ir)
{
   variable_entry *entry = this->get_variable_entry(ir->var);

   /* Allow whole-array assignments on the LHS.  We can split those
    * by "unrolling" the assignment into component-wise assignments.
    */
   if (in_assignee && in_whole_array_copy)
      return visit_continue;

   /* If we made it to here without seeing an ir_dereference_array,
    * then the dereference of this array didn't have a constant index
    * (see the visit_continue_with_parent below), so we can't split
    * the variable.
    */
   if (entry)
      entry->split = false;

   return visit_continue;
}